

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O2

int ExprEval::Operator::get_priority(string *symbol)

{
  vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
  *this;
  __type _Var1;
  reference pvVar2;
  size_t i;
  ulong __n;
  
  this = specification_table;
  __n = 0;
  while( true ) {
    if ((ulong)((long)(this->
                      super__Vector_base<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->
                      super__Vector_base<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 7) <= __n) {
      return -1;
    }
    pvVar2 = std::
             vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
             ::at(this,__n);
    _Var1 = std::operator==(&pvVar2->symbol,symbol);
    if (_Var1) break;
    __n = __n + 1;
  }
  pvVar2 = std::
           vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
           ::at(this,__n);
  return pvVar2->priority;
}

Assistant:

int get_priority(const std::string& symbol){
            auto table = specification_table;
            for(size_t i=0; i<table->size(); ++i){
                if(table->at(i).symbol == symbol) return table->at(i).priority;
            }
            return -1;
        }